

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::dht_tracker::get_peers
          (dht_tracker *this,sha1_hash *ih,
          function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
          *f)

{
  bool bVar1;
  tracker_node *this_00;
  announce_flags_t local_81;
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  local_80;
  function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  local_60;
  reference local_40;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  iterator __end2;
  iterator __begin2;
  tracker_nodes_t *__range2;
  function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  *f_local;
  sha1_hash *ih_local;
  dht_tracker *this_local;
  
  __end2 = ::std::
           map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
           ::begin(&this->m_nodes);
  n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
       *)::std::
         map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
         ::end(&this->m_nodes);
  while( true ) {
    bVar1 = ::std::operator!=(&__end2,(_Self *)&n);
    if (!bVar1) break;
    local_40 = ::std::
               _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
               ::operator*(&__end2);
    this_00 = &local_40->second;
    ::std::
    function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
    ::function(&local_60,f);
    ::std::
    function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
    ::function(&local_80);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>::
    bitfield_flag(&local_81);
    dht::node::get_peers(&this_00->dht,ih,&local_60,&local_80,local_81);
    ::std::
    function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
    ::~function(&local_80);
    ::std::
    function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
    ::~function(&local_60);
    ::std::
    _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void dht_tracker::get_peers(sha1_hash const& ih
		, std::function<void(std::vector<tcp::endpoint> const&)> f)
	{
		for (auto& n : m_nodes)
			n.second.dht.get_peers(ih, f, {}, {});
	}